

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

char * mpc_err_string(mpc_err_t *x)

{
  mpc_err_t *buffer_00;
  long lVar1;
  char *fmt;
  size_t sVar2;
  char *buffer;
  int local_20;
  int max;
  int pos;
  int i;
  mpc_err_t *x_local;
  
  local_20 = 0;
  buffer._4_4_ = 0x3ff;
  _pos = x;
  buffer_00 = (mpc_err_t *)calloc(1,0x400);
  if (_pos->failure == (char *)0x0) {
    lVar1 = (_pos->state).col + 1;
    mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4),
                       "%s:%li:%li: error: expected ",_pos->filename,(_pos->state).row + 1,lVar1);
    if (_pos->expected_num == 0) {
      mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4),
                         "ERROR: NOTHING EXPECTED");
    }
    if (_pos->expected_num == 1) {
      mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4),"%s",*_pos->expected
                        );
    }
    if (1 < _pos->expected_num) {
      for (max = 0; max < _pos->expected_num + -2; max = max + 1) {
        mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4),"%s, ",
                           _pos->expected[max]);
      }
      mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4),"%s or %s",
                         _pos->expected[_pos->expected_num + -2],
                         _pos->expected[_pos->expected_num + -1],lVar1);
    }
    mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4)," at ");
    fmt = mpc_err_char_unescape(_pos->received);
    mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4),fmt);
    mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4),"\n");
    sVar2 = strlen((char *)buffer_00);
    x_local = (mpc_err_t *)realloc(buffer_00,sVar2 + 1);
  }
  else {
    mpc_err_string_cat((char *)buffer_00,&local_20,(int *)((long)&buffer + 4),"%s: error: %s\n",
                       _pos->filename,_pos->failure);
    x_local = buffer_00;
  }
  return (char *)x_local;
}

Assistant:

char *mpc_err_string(mpc_err_t *x) {

  int i;
  int pos = 0;
  int max = 1023;
  char *buffer = calloc(1, 1024);

  if (x->failure) {
    mpc_err_string_cat(buffer, &pos, &max,
    "%s: error: %s\n", x->filename, x->failure);
    return buffer;
  }

  mpc_err_string_cat(buffer, &pos, &max,
    "%s:%li:%li: error: expected ", x->filename, x->state.row+1, x->state.col+1);

  if (x->expected_num == 0) { mpc_err_string_cat(buffer, &pos, &max, "ERROR: NOTHING EXPECTED"); }
  if (x->expected_num == 1) { mpc_err_string_cat(buffer, &pos, &max, "%s", x->expected[0]); }
  if (x->expected_num >= 2) {

    for (i = 0; i < x->expected_num-2; i++) {
      mpc_err_string_cat(buffer, &pos, &max, "%s, ", x->expected[i]);
    }

    mpc_err_string_cat(buffer, &pos, &max, "%s or %s",
      x->expected[x->expected_num-2],
      x->expected[x->expected_num-1]);
  }

  mpc_err_string_cat(buffer, &pos, &max, " at ");
  mpc_err_string_cat(buffer, &pos, &max, mpc_err_char_unescape(x->received));
  mpc_err_string_cat(buffer, &pos, &max, "\n");

  return realloc(buffer, strlen(buffer) + 1);
}